

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtp.c
# Opt level: O2

void rtp_pkt_pack(rtp_pkt_t *pkt)

{
  uint uVar1;
  rtp_bits_t rVar2;
  byte bVar3;
  char *__assertion;
  
  if (pkt == (rtp_pkt_t *)0x0) {
    __assertion = "pkt != NULL";
    uVar1 = 0x55;
LAB_001036d6:
    __assert_fail(__assertion,"/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/rtp.c",
                  uVar1,"void rtp_pkt_pack(rtp_pkt_t *)");
  }
  rVar2 = pkt->b;
  uVar1 = (uint)pkt->timestamp;
  bVar3 = rVar2._0_1_;
  pkt->data[0] = bVar3 >> 4 | bVar3 * '\x02' & 0x10 | bVar3 * '\b' & 0x20 | bVar3 << 6;
  pkt->data[1] = (byte)((uint)rVar2 >> 1) & 0x80 | (byte)((uint)rVar2 >> 9) & 0x7f;
  pkt->data[2] = rVar2._3_1_;
  pkt->data[3] = rVar2._2_1_;
  *(uint *)(pkt->data + 4) =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = (uint)pkt->ssrc;
  *(uint *)(pkt->data + 8) =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  if (pkt->pack != (_func_void_rtp_pkt_s_ptr *)0x0) {
    (*pkt->pack)(pkt);
    rVar2 = pkt->b;
  }
  if (((uint)rVar2 & 4) != 0) {
    bVar3 = pkt->plen;
    if (0x5db < pkt->length + (ulong)pkt->hlen + (ulong)bVar3 + (ulong)((uint)rVar2 >> 2 & 0x3d)) {
      __assertion = 
      "(pkt->length + pkt->hlen + pkt->b.cc * RTP_CSRC_SIZE + pkt->plen + 1) < RTP_PKT_SIZE";
      uVar1 = 0x71;
      goto LAB_001036d6;
    }
    pkt->data[(ulong)bVar3 + pkt->length + (ulong)pkt->hlen] = bVar3;
  }
  return;
}

Assistant:

void rtp_pkt_pack(rtp_pkt_t *pkt) {
  assert(pkt != NULL);
  
  /* v: 2 bits, p: 1 bit, x: 1 bit, cc: 4 bits */
  pkt->data[0] =  (pkt->b.v  & 0x3) << 6;
  pkt->data[0] |= (pkt->b.p  & 0x1) << 5;
  pkt->data[0] |= (pkt->b.x  & 0x1) << 4;
  pkt->data[0] |= (pkt->b.cc & 0xf);
  /* m: 1 bit, pt: 7 bits */
  pkt->data[1] =  (pkt->b.m & 0x1) << 7;
  pkt->data[1] |= (pkt->b.pt & 0x7f);

  unsigned char *ptr = pkt->data + 2;
  /* seq: 16 bits */
  UINT16_PACK(ptr, pkt->b.seq);
  /* timestamp: 32 bits */
  UINT32_PACK(ptr, pkt->timestamp);
  /* ssrc: 32 bits */
  UINT32_PACK(ptr, pkt->ssrc);

  if (pkt->pack)
    pkt->pack(pkt);

  /*M
    If we use padding, add padding length at the end of the payload.
  **/
  if (pkt->b.p) {
    assert((pkt->length +
            pkt->hlen + pkt->b.cc * RTP_CSRC_SIZE +
            pkt->plen + 1) < RTP_PKT_SIZE);
    
    unsigned char *ptr = pkt->data + pkt->hlen + pkt->length + pkt->plen;
    *ptr = pkt->plen;
  }
}